

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O3

void __thiscall dg::pta::PointerAnalysis::~PointerAnalysis(PointerAnalysis *this)

{
  pointer ppPVar1;
  
  this->_vptr_PointerAnalysis = (_func_int **)&PTR__PointerAnalysis_00122a28;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&(this->options).super_AnalysisOptions.allocationFunctions._M_t,
             *(_Link_type *)
              ((long)&(this->options).super_AnalysisOptions.allocationFunctions._M_t._M_impl.
                      super__Rb_tree_header._M_header + 8));
  ppPVar1 = (this->changed).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1,(long)(this->changed).
                                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar1
                   );
  }
  ppPVar1 = (this->to_process).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1,(long)(this->to_process).
                                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar1
                   );
    return;
  }
  return;
}

Assistant:

virtual ~PointerAnalysis() = default;